

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt.c
# Opt level: O0

bool_t mtCallOnce(size_t *once,_func_void_varargs *fn)

{
  size_t sVar1;
  code *in_RSI;
  size_t *in_RDI;
  size_t t;
  
  do {
    sVar1 = mtAtomicCmpSwap(in_RDI,0,0xffffffffffffffff);
    if (sVar1 == 0) {
      (*in_RSI)();
      *in_RDI = 1;
      return 1;
    }
  } while (sVar1 == 0xffffffffffffffff);
  return 1;
}

Assistant:

bool_t mtCallOnce(size_t* once, void (*fn)())
{
	size_t t;
	// попытки вызова
	do
		// удается захватить триггер?...
		if ((t = mtAtomicCmpSwap(once, 0, SIZE_MAX)) == 0)
		{
			// ... да, обработать захват
			fn(), *once = 1;
			break;
		}
	// ... нет, ожидаем обработки захвата в другом потоке
	while (t == SIZE_MAX);
	// завершить
	ASSERT(*once == 1);
	return TRUE;
}